

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

Value * __thiscall
vkt::shaderexecutor::DefaultSampling<tcu::Matrix<float,_4,_3>_>::genRandom
          (Value *__return_storage_ptr__,DefaultSampling<tcu::Matrix<float,_4,_3>_> *this,
          FloatFormat *fmt,Precision prec,Random *rnd)

{
  Precision extraout_EDX;
  Precision PVar1;
  Precision extraout_EDX_00;
  long lVar2;
  Value *this_00;
  int rowNdx;
  long lVar3;
  float *pfVar4;
  float fVar5;
  
  this_00 = __return_storage_ptr__;
  tcu::Matrix<float,_4,_3>::Matrix(__return_storage_ptr__);
  PVar1 = extraout_EDX;
  pfVar4 = (float *)__return_storage_ptr__;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    for (lVar2 = 0; lVar2 != 0x30; lVar2 = lVar2 + 0x10) {
      fVar5 = DefaultSampling<float>::genRandom((DefaultSampling<float> *)this_00,fmt,PVar1,rnd);
      *(float *)((long)pfVar4 + lVar2) = fVar5;
      PVar1 = extraout_EDX_00;
    }
    pfVar4 = pfVar4 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Value	genRandom	(const FloatFormat& fmt, Precision prec, Random& rnd) const
	{
		Value ret;

		for (int rowNdx = 0; rowNdx < Rows; ++rowNdx)
			for (int colNdx = 0; colNdx < Columns; ++colNdx)
				ret(rowNdx, colNdx) = instance<DefaultSampling<T> >().genRandom(fmt, prec, rnd);

		return ret;
	}